

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall ObjectFileDB::analyze_functions(ObjectFileDB *this)

{
  anon_class_8_1_be6bbe90 f;
  Config *pCVar1;
  ObjectFileDB *in_RDI;
  int total_basic_blocks;
  Timer timer;
  ObjectFileDB *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_1c;
  
  printf("- Analyzing Functions...\n");
  Timer::Timer((Timer *)0x19433b);
  pCVar1 = get_config();
  if ((pCVar1->find_basic_blocks & 1U) != 0) {
    Timer::start((Timer *)0x194350);
    local_1c = 0;
    f.total_basic_blocks._4_4_ = in_stack_ffffffffffffffc4;
    f.total_basic_blocks._0_4_ = in_stack_ffffffffffffffc0;
    for_each_function<ObjectFileDB::analyze_functions()::__0>(in_stack_ffffffffffffffb8,f);
    Timer::getMs((Timer *)0x194383);
    printf("Found %d basic blocks in %.3f ms\n",(ulong)local_1c);
  }
  Timer::start((Timer *)0x19439f);
  for_each_obj<ObjectFileDB::analyze_functions()::__1>(in_RDI);
  return;
}

Assistant:

void ObjectFileDB::analyze_functions() {
  printf("- Analyzing Functions...\n");
  Timer timer;

  if (get_config().find_basic_blocks) {
    timer.start();
    int total_basic_blocks = 0;
    for_each_function([&](Function& func, int segment_id, ObjectFileData& data) {
      auto blocks = find_blocks_in_function(data.linked_data, segment_id, func);
      total_basic_blocks += blocks.size();
      func.basic_blocks = blocks;
      func.analyze_prologue(data.linked_data);
    });

    printf("Found %d basic blocks in %.3f ms\n", total_basic_blocks, timer.getMs());
  }

  {
    timer.start();
    for_each_obj([&](ObjectFileData& data) {
      if(data.linked_data.segments == 3) {
        // the top level segment should have a single function
        assert(data.linked_data.functions_by_seg.at(2).size() == 1);

        auto& func = data.linked_data.functions_by_seg.at(2).front();
        assert(func.guessed_name.empty());
        func.guessed_name = "(top-level-init)";
        func.find_global_function_defs(data.linked_data);
      }
    });
  }
}